

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O3

void __thiscall IntVarEL::setBLearnable(IntVarEL *this,bool b)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  
  if (this->lit_min <= this->lit_max + 1) {
    iVar2 = this->lit_min;
    do {
      uVar3 = ((this->base_blit - (this->base_blit + -1 >> 0x1f)) + -1 >> 1) + iVar2;
      *(byte *)(sat.flags.data + uVar3) = *(byte *)(sat.flags.data + uVar3) & 0xfb | b * '\x04';
      uVar3 = ((this->base_blit - (this->base_blit + -1 >> 0x1f)) + -1 >> 1) + iVar2;
      bVar4 = *(byte *)(sat.flags.data + uVar3) & 0xfc;
      if (b) {
        bVar4 = *(byte *)(sat.flags.data + uVar3) | 2;
      }
      *(byte *)(sat.flags.data + uVar3) = bVar4;
      bVar1 = iVar2 <= this->lit_max;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void IntVarEL::setBLearnable(bool b) const {
	for (int i = lit_min; i <= lit_max + 1; i++) {
		sat.flags[(base_blit - 1) / 2 + i].setLearnable(b);
		sat.flags[(base_blit - 1) / 2 + i].setUIPable(b);
	}
}